

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

sqlite3_pcache * pcache1Create(int szPage,int szExtra,int bPurgeable)

{
  bool bVar1;
  PCacheGlobal *p;
  int in_EDX;
  undefined4 in_ESI;
  undefined4 in_EDI;
  int separateCache;
  int sz;
  PGroup *pGroup;
  PCache1 *pCache;
  u64 in_stack_ffffffffffffffe0;
  sqlite3_pcache *local_18;
  
  bVar1 = sqlite3Config.bCoreMutex < 1;
  local_18 = (sqlite3_pcache *)sqlite3MallocZero(in_stack_ffffffffffffffe0);
  if (local_18 != (sqlite3_pcache *)0x0) {
    if (bVar1) {
      p = &pcache1_g;
    }
    else {
      p = (PCacheGlobal *)(local_18 + 0x38);
      *(undefined4 *)(local_18 + 0x48) = 10;
    }
    *(PCacheGlobal **)local_18 = p;
    *(undefined4 *)(local_18 + 8) = in_EDI;
    *(undefined4 *)(local_18 + 0xc) = in_ESI;
    *(uint *)(local_18 + 0x10) = (uint)(in_EDX != 0);
    sqlite3_mutex_enter((sqlite3_mutex *)0x1b0396);
    pcache1ResizeHash(_separateCache);
    if (in_EDX != 0) {
      *(undefined4 *)(local_18 + 0x14) = 10;
      (p->grp).nMinPage = *(int *)(local_18 + 0x14) + (p->grp).nMinPage;
      (p->grp).mxPinned = ((p->grp).nMaxPage + 10) - (p->grp).nMinPage;
    }
    sqlite3_mutex_leave((sqlite3_mutex *)0x1b03ee);
    if (*(int *)(local_18 + 0x2c) == 0) {
      pcache1Destroy((sqlite3_pcache *)p);
      local_18 = (sqlite3_pcache *)0x0;
    }
  }
  return local_18;
}

Assistant:

static sqlite3_pcache *pcache1Create(int szPage, int szExtra, int bPurgeable){
  PCache1 *pCache;      /* The newly created page cache */
  PGroup *pGroup;       /* The group the new page cache will belong to */
  int sz;               /* Bytes of memory required to allocate the new cache */

  /*
  ** The separateCache variable is true if each PCache has its own private
  ** PGroup.  In other words, separateCache is true for mode (1) where no
  ** mutexing is required.
  **
  **   *  Always use a unified cache (mode-2) if ENABLE_MEMORY_MANAGEMENT
  **
  **   *  Always use a unified cache in single-threaded applications
  **
  **   *  Otherwise (if multi-threaded and ENABLE_MEMORY_MANAGEMENT is off)
  **      use separate caches (mode-1)
  */
#if defined(SQLITE_ENABLE_MEMORY_MANAGEMENT) || SQLITE_THREADSAFE==0
  const int separateCache = 0;
#else
  int separateCache = sqlite3GlobalConfig.bCoreMutex>0;
#endif

  assert( (szPage & (szPage-1))==0 && szPage>=512 && szPage<=65536 );
  assert( szExtra < 300 );

  sz = sizeof(PCache1) + sizeof(PGroup)*separateCache;
  pCache = (PCache1 *)sqlite3MallocZero(sz);
  if( pCache ){
    if( separateCache ){
      pGroup = (PGroup*)&pCache[1];
      pGroup->mxPinned = 10;
    }else{
      pGroup = &pcache1.grp;
    }
    pCache->pGroup = pGroup;
    pCache->szPage = szPage;
    pCache->szExtra = szExtra;
    pCache->bPurgeable = (bPurgeable ? 1 : 0);
    pcache1EnterMutex(pGroup);
    pcache1ResizeHash(pCache);
    if( bPurgeable ){
      pCache->nMin = 10;
      pGroup->nMinPage += pCache->nMin;
      pGroup->mxPinned = pGroup->nMaxPage + 10 - pGroup->nMinPage;
    }
    pcache1LeaveMutex(pGroup);
    if( pCache->nHash==0 ){
      pcache1Destroy((sqlite3_pcache*)pCache);
      pCache = 0;
    }
  }
  return (sqlite3_pcache *)pCache;
}